

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_> *
__thiscall
Catch::clara::detail::Opt::getHelpColumns
          (vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
           *__return_storage_ptr__,Opt *this)

{
  initializer_list<Catch::clara::detail::HelpColumns> __l;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  HelpColumns *local_268;
  allocator<Catch::clara::detail::HelpColumns> local_221;
  HelpColumns *local_220;
  HelpColumns local_218;
  iterator local_1d8;
  size_type local_1d0;
  reference local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *opt;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  ostringstream local_190 [7];
  bool first;
  ostringstream oss;
  Opt *this_local;
  
  ::std::__cxx11::ostringstream::ostringstream(local_190);
  bVar1 = true;
  __end3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->m_optNames);
  opt = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->m_optNames);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&opt);
    if (!bVar2) break;
    local_1b8 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end3);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      ::std::operator<<((ostream *)local_190,", ");
    }
    ::std::operator<<((ostream *)local_190,(string *)local_1b8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end3);
  }
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar4 = ::std::operator<<((ostream *)local_190," <");
    poVar4 = ::std::operator<<(poVar4,(string *)
                                      &(this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_hint
                              );
    ::std::operator<<(poVar4,">");
  }
  local_220 = &local_218;
  ::std::__cxx11::ostringstream::str();
  ::std::__cxx11::string::string
            ((string *)&local_218.right,
             (string *)&(this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_description);
  local_1d8 = &local_218;
  local_1d0 = 1;
  std::allocator<Catch::clara::detail::HelpColumns>::allocator(&local_221);
  __l._M_len = local_1d0;
  __l._M_array = local_1d8;
  std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  ::vector(__return_storage_ptr__,__l,&local_221);
  std::allocator<Catch::clara::detail::HelpColumns>::~allocator(&local_221);
  local_268 = (HelpColumns *)&local_1d8;
  do {
    local_268 = local_268 + -1;
    HelpColumns::~HelpColumns(local_268);
  } while (local_268 != &local_218);
  ::std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

auto getHelpColumns() const -> std::vector<HelpColumns> {
            std::ostringstream oss;
            bool first = true;
            for( auto const &opt : m_optNames ) {
                if (first)
                    first = false;
                else
                    oss << ", ";
                oss << opt;
            }
            if( !m_hint.empty() )
                oss << " <" << m_hint << ">";
            return { { oss.str(), m_description } };
        }